

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f77_wrap4.c
# Opt level: O1

void ftr2e_(float *A1,int *A2,char *A3,int *A4,size_t C3)

{
  float fval;
  int decim;
  char *s;
  size_t sVar1;
  char *pcVar2;
  size_t sVar3;
  char str [21];
  char local_48 [32];
  
  fval = *A1;
  decim = *A2;
  sVar3 = gMinStrLen;
  if (gMinStrLen <= C3) {
    sVar3 = C3;
  }
  s = (char *)malloc(sVar3 + 1);
  s[C3] = '\0';
  pcVar2 = A3;
  memcpy(s,A3,C3);
  kill_trailing(s,(char)pcVar2);
  ffr2e(fval,decim,s,A4);
  snprintf(local_48,0x15,"%20s",s);
  strcpy(s,local_48);
  if (s != (char *)0x0) {
    sVar1 = strlen(s);
    if (C3 <= sVar1) {
      sVar1 = C3;
    }
    memcpy(A3,s,sVar1);
    sVar1 = strlen(s);
    if (sVar1 <= C3 && C3 - sVar1 != 0) {
      memset(A3 + sVar1,0x20,C3 - sVar1);
    }
    free(s);
    return;
  }
  return;
}

Assistant:

CFextern VOID_cfF(FTR2E,ftr2e)
CFARGT14(NCF,DCF,ABSOFT_cf2(VOID),FLOAT,INT,PSTRING,PINT,CF_0,CF_0,CF_0,CF_0,CF_0,CF_0,CF_0,CF_0,CF_0,CF_0))
{
   QCF(FLOAT,1)
   QCF(INT,2)
   QCF(PSTRING,3)
   QCF(PINT,4)
   char str[21];

   ffr2e( TCF(ftr2e,FLOAT,1,0) 
          TCF(ftr2e,INT,2,1) 
          TCF(ftr2e,PSTRING,3,1) 
          TCF(ftr2e,PINT,4,1) );

   snprintf(str,21,"%20s",B3);
   strcpy(B3,str);

   RCF(FLOAT,1)
   RCF(INT,2)
   RCF(PSTRING,3)
   RCF(PINT,4)
}